

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O1

BinaryOperator slang::ast::OpInfo::getBinary(SyntaxKind kind)

{
  float fVar1;
  __index_type _Var2;
  undefined1 uVar3;
  undefined5 uVar4;
  undefined2 uVar5;
  bool *pbVar6;
  undefined6 uVar7;
  logic_t lVar8;
  logic_t lVar9;
  BinaryOperator BVar10;
  size_t sVar11;
  size_t sVar12;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:232:13),_const_std::variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>_&>
  cvl;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:232:13),_const_std::variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>_&>
  cvr;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar13;
  variant_alternative_t<3UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar14;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *rhs;
  variant_alternative_t<2UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar15;
  uint *__v;
  BinaryOperator op;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *in_RDX;
  uint in_ESI;
  undefined4 in_register_0000003c;
  ConstantValue *__return_storage_ptr__;
  void *p;
  SVInt *in_R8;
  _anonymous_namespace_ *this;
  bool bVar16;
  bool bVar17;
  double __x;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  _Variadic_union<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
  _Stack_d8;
  char cStack_b8;
  bool bStack_a9;
  _anonymous_namespace_ *p_Stack_a8;
  undefined8 uStack_a0;
  anon_class_16_2_9763bfdf_conflict aStack_98;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_88;
  char cStack_68;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *pvStack_60;
  _Variadic_union<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
  _Stack_58;
  char cStack_38;
  
  __return_storage_ptr__ = (ConstantValue *)CONCAT44(in_register_0000003c,kind);
  if ((int)kind < 0x10a) {
    if ((int)kind < 0x3b) {
      __v = &switchD_004d995c::switchdataD_0057079c;
      switch(kind) {
      case AddAssignmentExpression:
      case AddExpression:
        return Add;
      case AlwaysBlock:
      case AlwaysCombBlock:
      case AlwaysFFBlock:
      case AlwaysLatchBlock:
      case AndPropertyExpr:
      case AndSequenceExpr:
      case AnonymousProgram:
      case AnsiPortList:
      case AnsiUdpPortList:
      case ArgumentList:
        goto code_r0x004d9aa2;
      case AndAssignmentExpression:
        return BinaryAnd;
      case ArithmeticLeftShiftAssignmentExpression:
      case ArithmeticShiftLeftExpression:
        return ArithmeticShiftLeft;
      case ArithmeticRightShiftAssignmentExpression:
      case ArithmeticShiftRightExpression:
        return ArithmeticShiftRight;
      default:
        BVar10 = (*(code *)(&DAT_005707e0 +
                           *(int *)(&DAT_005707e0 + (ulong)(kind - BinaryAndExpression) * 4)))();
        return BVar10;
      }
    }
    if (0xb9 < (int)kind) {
      if (0xe0 < (int)kind) {
        if (kind == GreaterThanExpression) {
          return GreaterThan;
        }
        return Inequality;
      }
      if (kind == EqualityExpression) {
        return Equality;
      }
      return GreaterThanEqual;
    }
    if (0x9a < (int)kind) {
      return Divide;
    }
    if (kind == CaseEqualityExpression) {
      return CaseEquality;
    }
    return CaseInequality;
  }
  if (0x12a < (int)kind) {
    if ((int)kind < 0x1c3) {
      if ((int)kind < 0x138) {
        if (kind == ModExpression) {
          return Mod;
        }
      }
      else if (kind != MultiplyExpression) {
        if (kind != OrAssignmentExpression) {
          return Power;
        }
        return BinaryOr;
      }
      return Multiply;
    }
    if ((int)kind < 0x20c) {
      return Subtract;
    }
    if (kind != WildcardEqualityExpression) {
      if (kind == WildcardInequalityExpression) {
        return WildcardInequality;
      }
      return BinaryXor;
    }
    return WildcardEquality;
  }
  __return_storage_ptr__ = (ConstantValue *)(ulong)(kind - LessThanEqualExpression);
  if (0x12 < kind - LessThanEqualExpression) {
    return Mod;
  }
  __v = (uint *)((long)&switchD_004d9935::switchdataD_00570800 +
                (long)(int)(&switchD_004d9935::switchdataD_00570800)[(long)__return_storage_ptr__]);
  switch(__return_storage_ptr__) {
  case (ConstantValue *)0x0:
    return LessThanEqual;
  case (ConstantValue *)0x1:
    return LessThan;
  case (ConstantValue *)0xb:
    return LogicalAnd;
  case (ConstantValue *)0xc:
    return LogicalEquivalence;
  case (ConstantValue *)0xd:
    return LogicalImplication;
  case (ConstantValue *)0xe:
  case (ConstantValue *)0x11:
    return LogicalShiftLeft;
  case (ConstantValue *)0xf:
    return LogicalOr;
  case (ConstantValue *)0x10:
  case (ConstantValue *)0x12:
    return LogicalShiftRight;
  }
code_r0x004d9aa2:
  _Var2 = (in_RDX->
          super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ).
          super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ._M_index;
  if ((_Var2 == '\0') ||
     ((((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         *)__v)->
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ).
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._M_index == '\0')) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\0';
    goto switchD_004d9f0a_default;
  }
  this = (_anonymous_namespace_ *)(ulong)in_ESI;
  switch(_Var2) {
  case '\x01':
    pvVar13 = std::
              get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (in_RDX);
    _Var2 = (((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)__v)->
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ).
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index;
    if (_Var2 == '\x03') {
      pvVar14 = std::
                get<3ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            *)__v);
      bVar16 = NAN(pvVar14->v);
      bVar17 = pvVar14->v == 0.0;
LAB_004da142:
      _Stack_d8._0_1_ = !bVar17 | bVar16;
      (anonymous_namespace)::evalLogicalOp<slang::SVInt,bool>
                (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)in_ESI,
                 (BinaryOperator)pvVar13,(SVInt *)&_Stack_d8._M_first,(bool *)in_R8);
      goto switchD_004d9f0a_default;
    }
    if (_Var2 == '\x02') {
      pvVar15 = std::
                get<2ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            *)__v);
      bVar16 = NAN(pvVar15->v);
      bVar17 = pvVar15->v == 0.0;
      goto LAB_004da142;
    }
    if (_Var2 != '\x01') goto switchD_004d9f0a_default;
    break;
  case '\x02':
    pvVar15 = std::
              get<2ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (in_RDX);
    p_Stack_a8 = (_anonymous_namespace_ *)pvVar15->v;
    _Var2 = (((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)__v)->
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ).
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index;
    if (_Var2 == '\x01') {
      bVar16 = NAN((double)p_Stack_a8);
      bVar17 = (double)p_Stack_a8 == 0.0;
LAB_004da16e:
      _Stack_d8._0_1_ = !bVar17 | bVar16;
      pvVar13 = std::
                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            *)__v);
      (anonymous_namespace)::evalLogicalOp<bool,slang::SVInt>
                (__return_storage_ptr__,this,(BinaryOperator)&_Stack_d8,(bool *)pvVar13,in_R8);
      goto switchD_004d9f0a_default;
    }
    if (_Var2 != '\x03') {
      if (_Var2 == '\x02') {
        uStack_a0 = 0;
        std::
        get<2ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                  ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)__v);
        BVar10 = (*(code *)(&DAT_0057089c + *(int *)(&DAT_0057089c + (long)this * 4)))();
        return BVar10;
      }
      goto switchD_004d9f0a_default;
    }
    _Stack_d8._0_1_ = (double)p_Stack_a8 != 0.0;
    pvVar14 = std::
              get<3ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          *)__v);
    bVar16 = NAN(pvVar14->v);
    bVar17 = pvVar14->v == 0.0;
    goto LAB_004da065;
  case '\x03':
    pvVar14 = std::
              get<3ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (in_RDX);
    fVar1 = pvVar14->v;
    _Var2 = (((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)__v)->
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ).
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index;
    if (_Var2 == '\x01') {
      bVar16 = NAN(fVar1);
      bVar17 = fVar1 == 0.0;
      goto LAB_004da16e;
    }
    if (_Var2 != '\x02') {
      if (_Var2 == '\x03') {
        p_Stack_a8 = (_anonymous_namespace_ *)CONCAT44(p_Stack_a8._4_4_,fVar1);
        pvVar14 = std::
                  get<3ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                            ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              *)__v);
        (anonymous_namespace)::evalFloatOp<slang::shortreal_t,float>
                  (__return_storage_ptr__,this,op,p_Stack_a8._0_4_,pvVar14->v);
      }
      goto switchD_004d9f0a_default;
    }
    _Stack_d8._0_1_ = fVar1 != 0.0;
    pvVar15 = std::
              get<2ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          *)__v);
    bVar16 = NAN(pvVar15->v);
    bVar17 = pvVar15->v == 0.0;
LAB_004da065:
    _Stack_58._0_1_ = !bVar17 || bVar16;
    (anonymous_namespace)::evalLogicalOp<bool,bool>
              (__return_storage_ptr__,this,(BinaryOperator)&_Stack_d8,(bool *)&_Stack_58,
               (bool *)in_R8);
    goto switchD_004d9f0a_default;
  case '\x04':
    BVar10 = (*(code *)(&DAT_0057086c + *(int *)(&DAT_0057086c + (ulong)(in_ESI - 9) * 4)))();
    return BVar10;
  case '\x05':
  case '\a':
  case '\b':
    sVar11 = ConstantValue::size((ConstantValue *)in_RDX);
    sVar12 = ConstantValue::size((ConstantValue *)__v);
    if (sVar11 != sVar12) {
      _Stack_d8._12_1_ = 0;
      _Stack_d8._13_1_ = 0;
      _Stack_d8._0_1_ = 0;
      _Stack_d8._1_5_ = 0;
      _Stack_d8._6_2_ = 0;
      _Stack_d8._8_4_ = 1;
      SVInt::clearUnusedBits((SVInt *)&_Stack_d8._M_first);
      *(undefined8 *)
       &(__return_storage_ptr__->value).
        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           = 0;
      goto LAB_004da0d1;
    }
    p_Stack_a8 = this;
    std::
    visit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:270:9),_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
              ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:270:9),_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                *)&_Stack_d8._M_first,(anon_class_1_0_00000001 *)&_Stack_58._M_first,in_RDX);
    std::
    visit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:270:9),_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
              ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:270:9),_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                *)&_Stack_58._M_first,(anon_class_1_0_00000001 *)&_Stack_88,
               (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)__v);
    pvStack_60 = in_RDX;
    std::
    visit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:290:9),_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
              ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:290:9),_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                *)&_Stack_88,(anon_class_1_0_00000001 *)&aStack_98,in_RDX);
    aStack_98.__ret = &bStack_a9;
    bStack_a9 = true;
    aStack_98.__lhs =
         (variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
          *)&_Stack_d8;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>_&>
      ::_S_vtable._M_arr[(long)cStack_68 + 1]._M_data)
              (&aStack_98,
               (variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                *)&_Stack_88);
    if (bStack_a9 == false) {
      do {
        cvl = std::
              visit<slang::CVIterator<true>::dereference()const::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_const*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_const_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::ConstantValue_const*>>const&>
                        ((anon_class_1_0_00000001 *)&aStack_98,
                         (variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                          *)&_Stack_d8._M_first);
        cvr = std::
              visit<slang::CVIterator<true>::dereference()const::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_const*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_const_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::ConstantValue_const*>>const&>
                        ((anon_class_1_0_00000001 *)&aStack_98,
                         (variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                          *)&_Stack_58._M_first);
        eval((ConstantValue *)&_Stack_88,(BinaryOperator)p_Stack_a8,cvl,cvr);
        if (cStack_68 == '\0') {
          *(__index_type *)
           ((long)&(__return_storage_ptr__->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0x20) = '\0';
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&_Stack_88);
          goto switchD_004d9f0a_default;
        }
        pvVar13 = std::
                  get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                            ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              *)&_Stack_88);
        lVar8 = SVInt::reductionOr(pvVar13);
        bVar16 = true;
        if (lVar8.value != '@' && lVar8.value != 0x80) {
          bVar16 = lVar8.value == '\0';
          bVar16 = (bVar16 != true && bVar16 != true) && bVar16;
        }
        if (bVar16) {
          SVInt::SVInt((SVInt *)&aStack_98,lVar8);
          pbVar6 = aStack_98.__ret;
          *(undefined8 *)
           &(__return_storage_ptr__->value).
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               = 0;
          *(uint *)((long)&(__return_storage_ptr__->value).
                           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   + 8) = (uint)aStack_98.__lhs;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0xc) = aStack_98.__lhs._4_1_;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0xd) = aStack_98.__lhs._5_1_;
          if (0x40 < (uint)aStack_98.__lhs || ((ulong)aStack_98.__lhs & 0x10000000000) != 0) {
            aStack_98.__ret = (bool *)0x0;
          }
          *(bool **)&(__return_storage_ptr__->value).
                     super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               = pbVar6;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0x20) = '\x01';
          if ((0x40 < (uint)aStack_98.__lhs || ((ulong)aStack_98.__lhs & 0x10000000000) != 0) &&
             (aStack_98.__ret != (bool *)0x0)) {
            operator_delete__(aStack_98.__ret);
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&_Stack_88);
          if (bVar16) goto switchD_004d9f0a_default;
        }
        else {
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&_Stack_88);
        }
        cStack_68 = cStack_b8;
        aStack_98.__ret = (bool *)&_Stack_88;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>_&>
          ::_S_vtable._M_arr[(long)cStack_b8 + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict6 *)&aStack_98,
                   (variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                    *)&_Stack_d8);
        std::
        visit<slang::CVIterator<true>::increment()::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_const*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_const_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::ConstantValue_const*>>&>
                  ((anon_class_1_0_00000001 *)&aStack_98,
                   (variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                    *)&_Stack_d8._M_first);
        cStack_68 = cStack_38;
        aStack_98.__ret = (bool *)&_Stack_88;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>_&>
          ::_S_vtable._M_arr[(long)cStack_38 + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict6 *)&aStack_98,
                   (variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                    *)&_Stack_58);
        std::
        visit<slang::CVIterator<true>::increment()::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_const*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_const_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::ConstantValue_const*>>&>
                  ((anon_class_1_0_00000001 *)&aStack_98,
                   (variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                    *)&_Stack_58._M_first);
        std::
        visit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:290:9),_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                  ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:290:9),_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                    *)&_Stack_88,(anon_class_1_0_00000001 *)&aStack_98,pvStack_60);
        bStack_a9 = true;
        aStack_98.__ret = &bStack_a9;
        aStack_98.__lhs =
             (variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
              *)&_Stack_d8;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>_&>
          ::_S_vtable._M_arr[(long)cStack_68 + 1]._M_data)
                  (&aStack_98,
                   (variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                    *)&_Stack_88);
      } while (bStack_a9 == false);
    }
    _Stack_88._12_1_ = 0;
    _Stack_88._13_1_ = 0;
    _Stack_88._0_6_ = 1;
    _Stack_88._6_2_ = 0;
    _Stack_88._8_4_ = 1;
    SVInt::clearUnusedBits((SVInt *)&_Stack_88);
    uVar5 = _Stack_88._6_2_;
    uVar7 = _Stack_88._0_6_;
    *(undefined8 *)
     &(__return_storage_ptr__->value).
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         = 0;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 8) = _Stack_88._8_4_;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0xc) = _Stack_88._12_1_;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0xd) = _Stack_88._13_1_;
    if (0x40 < (uint)_Stack_88._8_4_ || (_Stack_88._13_1_ & 1) != 0) {
      _Stack_88._0_6_ = 0;
      _Stack_88._6_2_ = 0;
    }
    *(ulong *)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         = CONCAT26(uVar5,uVar7);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\x01';
    if (0x40 >= (uint)_Stack_88._8_4_ && (_Stack_88._13_1_ & 1) == 0) goto switchD_004d9f0a_default;
    p = (void *)CONCAT26(_Stack_88._6_2_,_Stack_88._0_6_);
    goto LAB_004da110;
  case '\x06':
    std::
    get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
              (in_RDX);
    std::
    get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
              ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)__v);
    BVar10 = (*(code *)(&DAT_0057087c + *(int *)(&DAT_0057087c + (ulong)(in_ESI - 9) * 4)))();
    return BVar10;
  default:
    BVar10 = (*(code *)(&DAT_0057097c + *(int *)(&DAT_0057097c + (ulong)(in_ESI - 9) * 4)))();
    return BVar10;
  }
  rhs = std::
        get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                  ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)__v);
  switch(in_ESI) {
  case 0:
    SVInt::operator+((SVInt *)&_Stack_d8._M_first,pvVar13);
    break;
  case 1:
    SVInt::operator-((SVInt *)&_Stack_d8._M_first,pvVar13);
    break;
  case 2:
    SVInt::operator*((SVInt *)&_Stack_d8._M_first,pvVar13);
    break;
  case 3:
    SVInt::operator/((SVInt *)&_Stack_d8._M_first,pvVar13);
    break;
  case 4:
    SVInt::operator%((SVInt *)&_Stack_d8._M_first,pvVar13);
    break;
  case 5:
    SVInt::operator&((SVInt *)&_Stack_d8._M_first,pvVar13);
    break;
  case 6:
    SVInt::operator|((SVInt *)&_Stack_d8._M_first,pvVar13);
    break;
  case 7:
    SVInt::operator^((SVInt *)&_Stack_d8._M_first,pvVar13);
    break;
  case 8:
    SVInt::xnor((SVInt *)&_Stack_d8._M_first,pvVar13);
    break;
  case 9:
    lVar8 = SVInt::operator==(pvVar13,rhs);
    goto LAB_004da530;
  case 10:
    lVar9 = SVInt::operator==(pvVar13,rhs);
    goto LAB_004da4db;
  case 0xb:
    lVar8.value = exactlyEqual(pvVar13,rhs);
    goto LAB_004da530;
  case 0xc:
    bVar16 = exactlyEqual(pvVar13,rhs);
    lVar8.value = !bVar16;
    goto LAB_004da530;
  case 0xd:
    lVar9 = SVInt::operator<(pvVar13,rhs);
    goto LAB_004da4db;
  case 0xe:
    lVar9 = SVInt::operator<=(pvVar13,rhs);
    goto LAB_004da4db;
  case 0xf:
    lVar8 = SVInt::operator<=(pvVar13,rhs);
    goto LAB_004da530;
  case 0x10:
    lVar8 = SVInt::operator<(pvVar13,rhs);
    goto LAB_004da530;
  case 0x11:
    lVar8 = condWildcardEqual(pvVar13,rhs);
    goto LAB_004da530;
  case 0x12:
    lVar9 = condWildcardEqual(pvVar13,rhs);
LAB_004da4db:
    lVar8.value = lVar9.value == '\0';
    if (lVar9.value == '@') {
      lVar8.value = 0x80;
    }
    if (lVar9.value == 0x80) {
      lVar8.value = 0x80;
    }
    goto LAB_004da530;
  case 0x13:
    lVar8 = SVInt::operator&&(pvVar13,rhs);
    goto LAB_004da530;
  case 0x14:
    lVar8 = SVInt::operator||(pvVar13,rhs);
    goto LAB_004da530;
  case 0x15:
    lVar8 = SVInt::logicalImpl(pvVar13,rhs);
    goto LAB_004da530;
  case 0x16:
    lVar8 = SVInt::logicalEquiv(pvVar13,rhs);
LAB_004da530:
    SVInt::SVInt((SVInt *)&_Stack_d8._M_first,lVar8);
    break;
  case 0x17:
  case 0x19:
    SVInt::shl((SVInt *)&_Stack_d8._M_first,pvVar13);
    break;
  case 0x18:
    SVInt::lshr((SVInt *)&_Stack_d8._M_first,pvVar13);
    break;
  case 0x1a:
    SVInt::ashr((SVInt *)&_Stack_d8._M_first,pvVar13);
    break;
  case 0x1b:
    SVInt::pow((SVInt *)&_Stack_d8._M_first,__x,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
    break;
  default:
    goto switchD_004d9f0a_default;
  }
  *(undefined8 *)
   &(__return_storage_ptr__->value).
    super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    .
    super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    .
    super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    .
    super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    .
    super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    .
    super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       = 0;
LAB_004da0d1:
  uVar5 = _Stack_d8._6_2_;
  uVar4 = _Stack_d8._1_5_;
  uVar3 = _Stack_d8._0_1_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
   + 8) = _Stack_d8._8_4_;
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
   + 0xc) = _Stack_d8._12_1_;
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
   + 0xd) = _Stack_d8._13_1_;
  if (0x40 < (uint)_Stack_d8._8_4_ || (_Stack_d8._13_1_ & 1) != 0) {
    _Stack_d8._0_1_ = 0;
    _Stack_d8._1_5_ = 0;
    _Stack_d8._6_2_ = 0;
  }
  *(ulong *)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       = CONCAT26(uVar5,CONCAT51(uVar4,uVar3));
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
   + 0x20) = '\x01';
  if (0x40 < (uint)_Stack_d8._8_4_ || (_Stack_d8._13_1_ & 1) != 0) {
    p = (void *)CONCAT26(_Stack_d8._6_2_,CONCAT51(_Stack_d8._1_5_,_Stack_d8._0_1_));
LAB_004da110:
    if (p != (void *)0x0) {
      operator_delete__(p);
    }
  }
switchD_004d9f0a_default:
  return (BinaryOperator)__return_storage_ptr__;
}

Assistant:

BinaryOperator OpInfo::getBinary(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AddExpression:
            return BinaryOperator::Add;
        case SyntaxKind::SubtractExpression:
            return BinaryOperator::Subtract;
        case SyntaxKind::MultiplyExpression:
            return BinaryOperator::Multiply;
        case SyntaxKind::DivideExpression:
            return BinaryOperator::Divide;
        case SyntaxKind::ModExpression:
            return BinaryOperator::Mod;
        case SyntaxKind::BinaryAndExpression:
            return BinaryOperator::BinaryAnd;
        case SyntaxKind::BinaryOrExpression:
            return BinaryOperator::BinaryOr;
        case SyntaxKind::BinaryXorExpression:
            return BinaryOperator::BinaryXor;
        case SyntaxKind::BinaryXnorExpression:
            return BinaryOperator::BinaryXnor;
        case SyntaxKind::EqualityExpression:
            return BinaryOperator::Equality;
        case SyntaxKind::InequalityExpression:
            return BinaryOperator::Inequality;
        case SyntaxKind::CaseEqualityExpression:
            return BinaryOperator::CaseEquality;
        case SyntaxKind::CaseInequalityExpression:
            return BinaryOperator::CaseInequality;
        case SyntaxKind::GreaterThanEqualExpression:
            return BinaryOperator::GreaterThanEqual;
        case SyntaxKind::GreaterThanExpression:
            return BinaryOperator::GreaterThan;
        case SyntaxKind::LessThanEqualExpression:
            return BinaryOperator::LessThanEqual;
        case SyntaxKind::LessThanExpression:
            return BinaryOperator::LessThan;
        case SyntaxKind::WildcardEqualityExpression:
            return BinaryOperator::WildcardEquality;
        case SyntaxKind::WildcardInequalityExpression:
            return BinaryOperator::WildcardInequality;
        case SyntaxKind::LogicalAndExpression:
            return BinaryOperator::LogicalAnd;
        case SyntaxKind::LogicalOrExpression:
            return BinaryOperator::LogicalOr;
        case SyntaxKind::LogicalImplicationExpression:
            return BinaryOperator::LogicalImplication;
        case SyntaxKind::LogicalEquivalenceExpression:
            return BinaryOperator::LogicalEquivalence;
        case SyntaxKind::LogicalShiftLeftExpression:
            return BinaryOperator::LogicalShiftLeft;
        case SyntaxKind::LogicalShiftRightExpression:
            return BinaryOperator::LogicalShiftRight;
        case SyntaxKind::ArithmeticShiftLeftExpression:
            return BinaryOperator::ArithmeticShiftLeft;
        case SyntaxKind::ArithmeticShiftRightExpression:
            return BinaryOperator::ArithmeticShiftRight;
        case SyntaxKind::PowerExpression:
            return BinaryOperator::Power;
        case SyntaxKind::AddAssignmentExpression:
            return BinaryOperator::Add;
        case SyntaxKind::SubtractAssignmentExpression:
            return BinaryOperator::Subtract;
        case SyntaxKind::MultiplyAssignmentExpression:
            return BinaryOperator::Multiply;
        case SyntaxKind::DivideAssignmentExpression:
            return BinaryOperator::Divide;
        case SyntaxKind::ModAssignmentExpression:
            return BinaryOperator::Mod;
        case SyntaxKind::AndAssignmentExpression:
            return BinaryOperator::BinaryAnd;
        case SyntaxKind::OrAssignmentExpression:
            return BinaryOperator::BinaryOr;
        case SyntaxKind::XorAssignmentExpression:
            return BinaryOperator::BinaryXor;
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
            return BinaryOperator::LogicalShiftLeft;
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
            return BinaryOperator::LogicalShiftRight;
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
            return BinaryOperator::ArithmeticShiftLeft;
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
            return BinaryOperator::ArithmeticShiftRight;
        default:
            SLANG_UNREACHABLE;
    }
}